

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::attempt_emit_loop_header
          (CompilerGLSL *this,SPIRBlock *block,Method method)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRBlock *pSVar4;
  SPIRBlock *pSVar5;
  BlockID local_290;
  BlockID local_28c;
  undefined1 local_288 [64];
  undefined1 local_248 [8];
  string condition_3;
  undefined1 local_228 [8];
  string continue_block_1;
  undefined1 local_208 [64];
  undefined1 local_1c8 [8];
  string condition_2;
  undefined1 local_1a8 [8];
  string initializer_1;
  uint32_t local_184;
  _Node_iterator_base<unsigned_int,_false> _Stack_180;
  uint32_t target_block;
  uint32_t local_174;
  _Node_iterator_base<unsigned_int,_false> local_170;
  char local_165;
  uint32_t local_164;
  bool condition_is_temporary_1;
  SPIRBlock *pSStack_160;
  uint32_t current_count_1;
  SPIRBlock *child;
  spirv_cross local_138 [32];
  undefined1 local_118 [8];
  string condition_1;
  undefined1 local_f8 [8];
  string continue_block;
  undefined1 local_d8 [80];
  undefined1 local_88 [8];
  string condition;
  undefined1 local_68 [8];
  string initializer;
  _Node_iterator_base<unsigned_int,_false> local_48;
  uint32_t local_3c;
  _Node_iterator_base<unsigned_int,_false> local_38;
  char local_2d;
  uint32_t local_2c;
  ContinueBlockType CStack_28;
  bool condition_is_temporary;
  uint32_t current_count;
  ContinueBlockType continue_type;
  Method method_local;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  current_count = method;
  _continue_type = block;
  block_local = (SPIRBlock *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->continue_block);
  pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
  CStack_28 = Compiler::continue_block_type(&this->super_Compiler,pSVar4);
  uVar2 = (uint32_t)this;
  if ((current_count == 0) || (current_count == 2)) {
    local_2c = this->statement_count;
    emit_block_instructions_with_masked_debug(this,_continue_type);
    local_3c = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->condition);
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&(this->super_Compiler).forced_temporaries,&local_3c);
    local_48._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this->super_Compiler).forced_temporaries);
    local_2d = ::std::__detail::operator==(&local_38,&local_48);
    if ((local_2c == this->statement_count) && ((bool)local_2d)) {
      if (CStack_28 == ForLoop) {
        flush_undeclared_variables(this,_continue_type);
        emit_for_loop_initializers_abi_cxx11_((CompilerGLSL *)local_68,(SPIRBlock *)this);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->condition);
        to_expression_abi_cxx11_((CompilerGLSL *)local_88,uVar2,SUB41(uVar3,0));
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((CompilerGLSL *)local_d8,(string *)this);
          join<char_const(&)[2],std::__cxx11::string>
                    ((spirv_cross *)(local_d8 + 0x20),(char (*) [2])0x5fdfc7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
          ::std::__cxx11::string::operator=((string *)local_88,(string *)(local_d8 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_d8 + 0x20));
          ::std::__cxx11::string::~string((string *)local_d8);
        }
        (*(this->super_Compiler)._vptr_Compiler[0x37])(this,_continue_type);
        if (current_count == 2) {
          statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
                    (this,(char (*) [6])"for (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (char (*) [3])0x5eee98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (char (*) [4])"; )");
        }
        else {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->continue_block)
          ;
          emit_continue_block_abi_cxx11_((CompilerGLSL *)local_f8,uVar2,SUB41(uVar3,0),false);
          statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (this,(char (*) [6])"for (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (char (*) [3])0x5eee98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (char (*) [3])0x5eee98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     (char (*) [2])0x5eaa1a);
          ::std::__cxx11::string::~string((string *)local_f8);
        }
        ::std::__cxx11::string::~string((string *)local_88);
        ::std::__cxx11::string::~string((string *)local_68);
      }
      else {
        if (CStack_28 != WhileLoop) {
          _continue_type->disable_block_optimization = true;
          Compiler::force_recompile(&this->super_Compiler);
          begin_scope(this);
          return false;
        }
        flush_undeclared_variables(this,_continue_type);
        emit_while_loop_initializers(this,_continue_type);
        (*(this->super_Compiler)._vptr_Compiler[0x37])(this,_continue_type);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->condition);
        to_expression_abi_cxx11_((CompilerGLSL *)local_118,uVar2,SUB41(uVar3,0));
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((CompilerGLSL *)&child,(string *)this);
          join<char_const(&)[2],std::__cxx11::string>
                    (local_138,(char (*) [2])0x5fdfc7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child);
          ::std::__cxx11::string::operator=((string *)local_118,(string *)local_138);
          ::std::__cxx11::string::~string((string *)local_138);
          ::std::__cxx11::string::~string((string *)&child);
        }
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [8])"while (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (char (*) [2])0x5eaa1a);
        ::std::__cxx11::string::~string((string *)local_118);
      }
      begin_scope(this);
      this_local._7_1_ = true;
    }
    else {
      _continue_type->disable_block_optimization = true;
      Compiler::force_recompile(&this->super_Compiler);
      begin_scope(this);
      this_local._7_1_ = false;
    }
  }
  else if (current_count == 1) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->next_block);
    pSStack_160 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
    flush_undeclared_variables(this,pSStack_160);
    local_164 = this->statement_count;
    emit_block_instructions_with_masked_debug(this,pSStack_160);
    local_174 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->condition);
    local_170._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&(this->super_Compiler).forced_temporaries,&local_174);
    _Stack_180._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this->super_Compiler).forced_temporaries);
    local_165 = ::std::__detail::operator==(&local_170,&stack0xfffffffffffffe80);
    if ((local_164 == this->statement_count) && ((bool)local_165)) {
      local_184 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->true_block);
      if (CStack_28 == ForLoop) {
        emit_for_loop_initializers_abi_cxx11_((CompilerGLSL *)local_1a8,(SPIRBlock *)this);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->condition);
        to_expression_abi_cxx11_((CompilerGLSL *)local_1c8,uVar2,SUB41(uVar3,0));
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar3);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((CompilerGLSL *)local_208,(string *)this);
          join<char_const(&)[2],std::__cxx11::string>
                    ((spirv_cross *)(local_208 + 0x20),(char (*) [2])0x5fdfc7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
          ;
          ::std::__cxx11::string::operator=((string *)local_1c8,(string *)(local_208 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_208 + 0x20));
          ::std::__cxx11::string::~string((string *)local_208);
          local_184 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->false_block);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->continue_block);
        emit_continue_block_abi_cxx11_((CompilerGLSL *)local_228,uVar2,SUB41(uVar3,0),false);
        (*(this->super_Compiler)._vptr_Compiler[0x37])(this,_continue_type);
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [6])"for (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   (char (*) [3])0x5eee98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   (char (*) [3])0x5eee98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   (char (*) [2])0x5eaa1a);
        ::std::__cxx11::string::~string((string *)local_228);
        ::std::__cxx11::string::~string((string *)local_1c8);
        ::std::__cxx11::string::~string((string *)local_1a8);
      }
      else {
        if (CStack_28 != WhileLoop) {
          _continue_type->disable_block_optimization = true;
          Compiler::force_recompile(&this->super_Compiler);
          begin_scope(this);
          return false;
        }
        emit_while_loop_initializers(this,_continue_type);
        (*(this->super_Compiler)._vptr_Compiler[0x37])(this,_continue_type);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->condition);
        to_expression_abi_cxx11_((CompilerGLSL *)local_248,uVar2,SUB41(uVar3,0));
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((CompilerGLSL *)local_288,(string *)this);
          join<char_const(&)[2],std::__cxx11::string>
                    ((spirv_cross *)(local_288 + 0x20),(char (*) [2])0x5fdfc7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
          ;
          ::std::__cxx11::string::operator=((string *)local_248,(string *)(local_288 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_288 + 0x20));
          ::std::__cxx11::string::~string((string *)local_288);
          local_184 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_160->false_block);
        }
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [8])"while (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   (char (*) [2])0x5eaa1a);
        ::std::__cxx11::string::~string((string *)local_248);
      }
      begin_scope(this);
      local_28c.id = (uint32_t)
                     TypedID::operator_cast_to_TypedID
                               ((TypedID *)&(pSStack_160->super_IVariant).self);
      TypedID<(spirv_cross::Types)6>::TypedID(&local_290,local_184);
      branch(this,local_28c,local_290);
      this_local._7_1_ = true;
    }
    else {
      _continue_type->disable_block_optimization = true;
      Compiler::force_recompile(&this->super_Compiler);
      begin_scope(this);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::attempt_emit_loop_header(SPIRBlock &block, SPIRBlock::Method method)
{
	SPIRBlock::ContinueBlockType continue_type = continue_block_type(get<SPIRBlock>(block.continue_block));

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		uint32_t current_count = statement_count;
		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(block);

		bool condition_is_temporary = forced_temporaries.find(block.condition) == end(forced_temporaries);

		// This can work! We only did trivial things which could be forwarded in block body!
		if (current_count == statement_count && condition_is_temporary)
		{
			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
				flush_undeclared_variables(block);

				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(block.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				emit_block_hints(block);
				if (method != SPIRBlock::MergeToSelectContinueForLoop)
				{
					auto continue_block = emit_continue_block(block.continue_block, false, false);
					statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				}
				else
					statement("for (", initializer, "; ", condition, "; )");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the while loop header.
				flush_undeclared_variables(block);
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(block.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		auto &child = get<SPIRBlock>(block.next_block);

		// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
		flush_undeclared_variables(child);

		uint32_t current_count = statement_count;

		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(child);

		bool condition_is_temporary = forced_temporaries.find(child.condition) == end(forced_temporaries);

		if (current_count == statement_count && condition_is_temporary)
		{
			uint32_t target_block = child.true_block;

			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(child.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				auto continue_block = emit_continue_block(block.continue_block, false, false);
				emit_block_hints(block);
				statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(child.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			branch(child.self, target_block);
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else
		return false;
}